

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsIndexingArray1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  undefined1 *puVar3;
  TestError *pTVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  string *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string variable_declaration;
  string shader_source;
  string variable_initializations [8];
  
  shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
  shader_source._M_string_length = 0;
  shader_source.field_2._M_local_buf[0] = '\0';
  variable_declaration._M_dataplus._M_p = (pointer)&variable_declaration.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&variable_declaration,"float x[1][1][1][1][1][1][1][1];\n\n","");
  variable_initializations[0]._M_dataplus._M_p = (pointer)&variable_initializations[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)variable_initializations,
             "x[0]                      = float[1][1][1][1][1][1][1](float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))))));\n"
             ,"");
  variable_initializations[1]._M_dataplus._M_p = (pointer)&variable_initializations[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 1),
             "x[0][0]                   = float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))))));\n"
             ,"");
  variable_initializations[2]._M_dataplus._M_p = (pointer)&variable_initializations[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 2),
             "x[0][0][0]                = float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))));\n"
             ,"");
  variable_initializations[3]._M_dataplus._M_p = (pointer)&variable_initializations[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 3),
             "x[0][0][0][0]             = float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))));\n"
             ,"");
  variable_initializations[4]._M_dataplus._M_p = (pointer)&variable_initializations[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 4),
             "x[0][0][0][0][0]          = float[1][1][1](float[1][1](float[1](1.0)));\n","");
  variable_initializations[5]._M_dataplus._M_p = (pointer)&variable_initializations[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 5),
             "x[0][0][0][0][0][0]       = float[1][1](float[1](1.0));\n","");
  variable_initializations[6]._M_dataplus._M_p = (pointer)&variable_initializations[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 6),"x[0][0][0][0][0][0][0]    = float[1](1.0);\n"
             ,"");
  paVar10 = &variable_initializations[7].field_2;
  variable_initializations[7]._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(variable_initializations + 7),"x[0][0][0][0][0][0][0][0] = 1.0;\n","");
  lVar11 = 0;
  do {
    std::operator+(&local_1a0,&variable_declaration,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shader_start_abi_cxx11_);
    std::__cxx11::string::operator=((string *)&shader_source,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_1a0,"    ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&variable_initializations[0]._M_dataplus._M_p + lVar11));
    std::__cxx11::string::_M_append((char *)&shader_source,(ulong)local_1a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    puVar2 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
    case COMPUTE_SHADER_TYPE:
    case TESSELATION_EVALUATION_SHADER_TYPE:
      break;
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&shader_source);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar2 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&shader_source,*puVar2);
      break;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xc7f);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
    puVar7 = empty_string_abi_cxx11_;
    puVar6 = empty_string_abi_cxx11_;
    puVar5 = empty_string_abi_cxx11_;
    puVar8 = empty_string_abi_cxx11_;
    puVar3 = (undefined1 *)&shader_source;
    psVar9 = (string *)empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar3 = empty_string_abi_cxx11_;
      puVar7 = default_vertex_shader_source_abi_cxx11_;
      puVar6 = default_tc_shader_source_abi_cxx11_;
      puVar5 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
      puVar8 = default_geometry_shader_source_abi_cxx11_;
      psVar9 = &shader_source;
      break;
    case VERTEX_SHADER_TYPE:
      puVar6 = default_tc_shader_source_abi_cxx11_;
      puVar7 = (undefined1 *)&shader_source;
      goto LAB_00b5efd0;
    case COMPUTE_SHADER_TYPE:
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar7 = default_vertex_shader_source_abi_cxx11_;
      puVar6 = default_tc_shader_source_abi_cxx11_;
      puVar5 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
      puVar8 = (undefined1 *)&shader_source;
      goto LAB_00b5f011;
    case TESSELATION_CONTROL_SHADER_TYPE:
      puVar6 = (undefined1 *)&shader_source;
      puVar7 = default_vertex_shader_source_abi_cxx11_;
LAB_00b5efd0:
      puVar5 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
LAB_00b5f00a:
      puVar8 = default_geometry_shader_source_abi_cxx11_;
LAB_00b5f011:
      puVar3 = empty_string_abi_cxx11_;
      psVar9 = (string *)default_fragment_shader_source_abi_cxx11_;
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar7 = default_vertex_shader_source_abi_cxx11_;
      puVar6 = default_tc_shader_source_abi_cxx11_;
      puVar5 = (undefined1 *)&shader_source;
      goto LAB_00b5f00a;
    default:
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xc82);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,puVar7,puVar6,puVar5,puVar8,psVar9,puVar3,1,0);
    lVar11 = lVar11 + 0x20;
    if (lVar11 == 0x100) {
      lVar11 = -0x100;
      do {
        plVar1 = (long *)(((string *)(paVar10 + -1))->_M_dataplus)._M_p;
        if (paVar10 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar1) {
          operator_delete(plVar1,paVar10->_M_allocated_capacity + 1);
        }
        paVar10 = paVar10 + -2;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)variable_declaration._M_dataplus._M_p != &variable_declaration.field_2) {
        operator_delete(variable_declaration._M_dataplus._M_p,
                        variable_declaration.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
        operator_delete(shader_source._M_dataplus._M_p,
                        CONCAT71(shader_source.field_2._M_allocated_capacity._1_7_,
                                 shader_source.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void ExpressionsIndexingArray1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_source;
	std::string variable_declaration = "float x[1][1][1][1][1][1][1][1];\n\n";

	std::string variable_initializations[] = {
		"x[0]                      = float[1][1][1][1][1][1][1]("
		"float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))))));"
		"\n",
		"x[0][0]                   = "
		"float[1][1][1][1][1][1](float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))))));"
		"\n",
		"x[0][0][0]                = "
		"float[1][1][1][1][1](float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0)))));\n",
		"x[0][0][0][0]             = float[1][1][1][1](float[1][1][1](float[1][1](float[1](1.0))));\n",
		"x[0][0][0][0][0]          = float[1][1][1](float[1][1](float[1](1.0)));\n",
		"x[0][0][0][0][0][0]       = float[1][1](float[1](1.0));\n", "x[0][0][0][0][0][0][0]    = float[1](1.0);\n",
		"x[0][0][0][0][0][0][0][0] = 1.0;\n"
	};

	for (size_t string_index = 0; string_index < sizeof(variable_initializations) / sizeof(variable_initializations[0]);
		 string_index++)
	{
		shader_source = variable_declaration + shader_start;
		shader_source += "    " + variable_initializations[string_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int string_index = 0; ...) */
}